

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool EV_MovePolyTo(line_t *line,int polyNum,double speed,DVector2 *targ,bool overRide)

{
  double dVar1;
  FPolyObj *pFVar2;
  DPolyAction *pDVar3;
  DMovePolyTo *this;
  bool bVar4;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  TVector2<double> local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined1 local_1e8 [16];
  FPolyMirrorIterator it;
  
  local_228._8_4_ = in_XMM0_Dc;
  local_228._0_8_ = speed;
  local_228._12_4_ = in_XMM0_Dd;
  it.CurPoly = PO_GetPolyobj(polyNum);
  if (it.CurPoly == (FPolyObj *)0x0) {
    bVar4 = false;
    Printf("EV_MovePolyTo: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
  }
  else {
    it.UsedPolys[0] = (it.CurPoly)->tag;
    it.NumUsedPolys = 1;
    dVar1 = targ->Y - ((it.CurPoly)->StartSpot).pos.Y;
    local_238.Y._0_4_ = SUB84(dVar1,0);
    local_238.X = targ->X - ((it.CurPoly)->StartSpot).pos.X;
    local_238.Y._4_4_ = (int)((ulong)dVar1 >> 0x20);
    dVar1 = TVector2<double>::MakeUnit(&local_238);
    local_1f8 = dVar1 / (double)local_228._0_8_;
    local_208 = (double)local_228._0_8_;
    dStack_200 = (double)local_228._0_8_;
    local_1e8._8_4_ = extraout_XMM0_Dc;
    local_1e8._0_8_ = dVar1;
    local_1e8._12_4_ = extraout_XMM0_Dd;
    local_218._8_4_ = SUB84(dVar1,0);
    local_218._0_8_ = dVar1;
    local_218._12_4_ = (int)((ulong)dVar1 >> 0x20);
    bVar4 = false;
    while (pFVar2 = FPolyMirrorIterator::NextMirror(&it), pFVar2 != (FPolyObj *)0x0) {
      pDVar3 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&pFVar2->specialdata);
      if (pDVar3 == (DPolyAction *)0x0) {
        if (pFVar2->bBlocked == true && !overRide) {
          return bVar4;
        }
      }
      else if (!overRide) {
        return bVar4;
      }
      this = (DMovePolyTo *)DObject::operator_new(0x78);
      DMovePolyTo::DMovePolyTo(this,pFVar2->tag);
      (pFVar2->specialdata).field_0.p = (DPolyAction *)this;
      pFVar2->bBlocked = false;
      (this->super_DPolyAction).m_Dist = (double)local_1e8._0_8_;
      (this->super_DPolyAction).m_Speed = (double)local_228._0_8_;
      (this->m_Speedv).X = local_238.X * local_208;
      (this->m_Speedv).Y = local_238.Y * dStack_200;
      dVar1 = (pFVar2->StartSpot).pos.Y;
      (this->m_Target).X = (pFVar2->StartSpot).pos.X + (double)local_218._0_8_ * local_238.X;
      (this->m_Target).Y = dVar1 + (double)local_218._8_8_ * local_238.Y;
      if (local_1f8 <= 2.0) {
        DPolyAction::StopInterpolation((DPolyAction *)this);
      }
      local_238.X = -(double)CONCAT44(local_238.X._4_4_,local_238.X._0_4_);
      local_238.Y._4_4_ = local_238.Y._4_4_ ^ 0x80000000;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool EV_MovePolyTo(line_t *line, int polyNum, double speed, const DVector2 &targ, bool overRide)
{
	DMovePolyTo *pe = NULL;
	FPolyObj *poly;
	DVector2 dist;
	double distlen;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePolyTo: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	dist = targ - poly->StartSpot.pos;
	distlen = dist.MakeUnit();
	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePolyTo(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = distlen;
		pe->m_Speed = speed;
		pe->m_Speedv = dist * speed;
		pe->m_Target = poly->StartSpot.pos + dist * distlen;
		if ((pe->m_Dist / pe->m_Speed) <= 2)
		{
			pe->StopInterpolation();
		}
		dist = -dist;	// reverse the direction
	}
	return pe != NULL; // Return true if something started moving.
}